

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::SplitBailOnImplicitCall(Lowerer *this,Instr **instr)

{
  Func *pFVar1;
  Instr *this_00;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  BailOutKind BVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  MemRefOpnd *opnd;
  IntConstOpnd *opnd_00;
  undefined4 extraout_var_00;
  Opnd *dstOpnd;
  IntConstOpnd *pIVar8;
  Instr *instr_00;
  Instr *instr_01;
  Instr *instr_02;
  undefined1 local_68 [8];
  AutoReuseOpnd autoReuseImplicitCallFlags;
  AutoReuseOpnd autoReuseNoImplicitCall;
  
  bVar3 = IR::Instr::IsPlainInstr(*instr);
  if ((!bVar3) && ((*instr)->m_kind != InstrKindProfiled)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x360f,"(instr->IsPlainInstr() || instr->IsProfiledInstr())",
                       "instr->IsPlainInstr() || instr->IsProfiledInstr()");
    if (!bVar3) goto LAB_005e3ba1;
    *puVar7 = 0;
  }
  BVar5 = IR::Instr::GetBailOutKind(*instr);
  if ((BVar5 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3612,"(BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))",
                       "BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind)");
    if (!bVar3) goto LAB_005e3ba1;
    *puVar7 = 0;
  }
  pFVar1 = this->m_func;
  iVar6 = (*pFVar1->m_threadContextInfo->_vptr_ThreadContextInfo[5])();
  opnd = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar6),TyUint8,pFVar1,AddrOpndKindDynamicMisc);
  local_68 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_68,&opnd->super_Opnd,(*instr)->m_func,true);
  opnd_00 = IR::IntConstOpnd::New(1,TyInt8,this->m_func,true);
  autoReuseImplicitCallFlags.autoDelete = false;
  autoReuseImplicitCallFlags.wasInUse = false;
  autoReuseImplicitCallFlags._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseImplicitCallFlags.autoDelete,&opnd_00->super_Opnd,
             (*instr)->m_func,true);
  InsertMove(&opnd->super_Opnd,&opnd_00->super_Opnd,*instr,true);
  if ((BVar5 & ~LazyBailOut) == BailOutOnImplicitCallsPreOp) {
    iVar6 = (*(*instr)->m_func->m_threadContextInfo->_vptr_ThreadContextInfo[4])();
    dstOpnd = LowererMD::GenerateMemRef
                        (&this->m_lowererMD,CONCAT44(extraout_var_00,iVar6),TyInt8,*instr,false);
    pIVar8 = IR::IntConstOpnd::New(1,TyInt8,(*instr)->m_func,true);
    instr_00 = IR::Instr::New(Ld_A,dstOpnd,&pIVar8->super_Opnd,(*instr)->m_func);
    IR::Instr::InsertBefore(*instr,instr_00);
    pIVar8 = IR::IntConstOpnd::New(0,TyInt8,(*instr)->m_func,true);
    instr_01 = IR::Instr::New(Ld_A,dstOpnd,&pIVar8->super_Opnd,(*instr)->m_func);
    instr_01->m_noLazyHelperAssert = true;
  }
  else {
    instr_00 = (Instr *)0x0;
    instr_01 = (Instr *)0x0;
  }
  this_00 = *instr;
  instr_02 = IR::Instr::New(this_00->m_opcode,this_00->m_func);
  *instr = instr_02;
  IR::Instr::TransferTo(this_00,instr_02);
  IR::Instr::InsertBefore(this_00,*instr);
  if (instr_00 != (Instr *)0x0) {
    if (instr_01 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3644,"(enableImplicitCallsInstr)","enableImplicitCallsInstr");
      if (!bVar3) goto LAB_005e3ba1;
      *puVar7 = 0;
    }
    IR::Instr::InsertBefore(this_00,instr_01);
    LowererMD::ChangeToAssign(instr_00);
    LowererMD::ChangeToAssign(instr_01);
  }
  this_00->m_opcode = BailOnNotEqual;
  if (this_00->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005e3ba1;
    *puVar7 = 0;
  }
  pFVar1 = this_00->m_func;
  if ((opnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_005e3ba1;
    *puVar7 = 0;
  }
  bVar4 = (opnd->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    opnd = (MemRefOpnd *)IR::Opnd::Copy(&opnd->super_Opnd,pFVar1);
    bVar4 = (opnd->super_Opnd).field_0xb;
  }
  (opnd->super_Opnd).field_0xb = bVar4 | 2;
  this_00->m_src1 = &opnd->super_Opnd;
  if (this_00->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005e3ba1;
    *puVar7 = 0;
  }
  pFVar1 = this_00->m_func;
  if ((opnd_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005e3ba1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  bVar4 = (opnd_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    opnd_00 = (IntConstOpnd *)IR::Opnd::Copy(&opnd_00->super_Opnd,pFVar1);
    bVar4 = (opnd_00->super_Opnd).field_0xb;
  }
  (opnd_00->super_Opnd).field_0xb = bVar4 | 2;
  this_00->m_src2 = &opnd_00->super_Opnd;
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseImplicitCallFlags.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_68);
  return this_00;
}

Assistant:

IR::Instr *
Lowerer::SplitBailOnImplicitCall(IR::Instr *& instr)
{
    Assert(instr->IsPlainInstr() || instr->IsProfiledInstr());

    const auto bailOutKind = instr->GetBailOutKind();
    Assert(BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind));

    IR::Opnd * implicitCallFlags = this->GetImplicitCallFlagsOpnd();
    const IR::AutoReuseOpnd autoReuseImplicitCallFlags(implicitCallFlags, instr->m_func);
    IR::IntConstOpnd * noImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_None, TyInt8, this->m_func, true);
    const IR::AutoReuseOpnd autoReuseNoImplicitCall(noImplicitCall, instr->m_func);

    // Reset the implicit call flag on every helper call
    Lowerer::InsertMove(implicitCallFlags, noImplicitCall, instr);

    IR::Instr *disableImplicitCallsInstr = nullptr, *enableImplicitCallsInstr = nullptr;
    if(BailOutInfo::WithoutLazyBailOut(bailOutKind) == IR::BailOutOnImplicitCallsPreOp)
    {
        const auto disableImplicitCallAddress =
            m_lowererMD.GenerateMemRef(
                instr->m_func->GetThreadContextInfo()->GetDisableImplicitFlagsAddr(),
                TyInt8,
                instr);

        // Disable implicit calls since they will be called after bailing out
        disableImplicitCallsInstr =
            IR::Instr::New(
                Js::OpCode::Ld_A,
                disableImplicitCallAddress,
                IR::IntConstOpnd::New(DisableImplicitCallFlag, TyInt8, instr->m_func, true),
                instr->m_func);
        instr->InsertBefore(disableImplicitCallsInstr);

        // Create instruction for re-enabling implicit calls
        enableImplicitCallsInstr =
            IR::Instr::New(
                Js::OpCode::Ld_A,
                disableImplicitCallAddress,
                IR::IntConstOpnd::New(DisableImplicitNoFlag, TyInt8, instr->m_func, true),
                instr->m_func);

#if DBG
        enableImplicitCallsInstr->m_noLazyHelperAssert = true;
#endif
    }

    IR::Instr * bailOutInstr = instr;

    instr = IR::Instr::New(instr->m_opcode, instr->m_func);
    bailOutInstr->TransferTo(instr);
    bailOutInstr->InsertBefore(instr);

    if(disableImplicitCallsInstr)
    {
        // Re-enable implicit calls
        Assert(enableImplicitCallsInstr);
        bailOutInstr->InsertBefore(enableImplicitCallsInstr);

        // Lower both instructions. Lowering an instruction may free the instruction's original operands, so do that last.
        LowererMD::ChangeToAssign(disableImplicitCallsInstr);
        LowererMD::ChangeToAssign(enableImplicitCallsInstr);
    }

    bailOutInstr->m_opcode = Js::OpCode::BailOnNotEqual;

    bailOutInstr->SetSrc1(implicitCallFlags);
    bailOutInstr->SetSrc2(noImplicitCall);

    return bailOutInstr;
}